

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxsender.c
# Opt level: O1

void test_basic(void)

{
  quicly_sent_t *pqVar1;
  ulong uVar2;
  st_quicly_sent_block_t *psVar3;
  size_t sVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  quicly_sentmap_iter_t local_70;
  undefined1 local_58 [24];
  quicly_sent_acked_cb p_Stack_40;
  undefined8 local_38;
  
  local_58._0_16_ = (undefined1  [16])0x0;
  stack0xffffffffffffffb8 = (undefined1  [16])0x0;
  lVar8 = 0;
  lVar7 = 0;
  do {
    lVar6 = 1;
    do {
      local_38 = 0;
      quicly_sentmap_prepare((quicly_sentmap_t *)local_58,lVar8 + lVar6,lVar7,'\0');
      if ((((st_quicly_sent_block_t *)local_58._8_8_ != (st_quicly_sent_block_t *)0x0) &&
          (psVar3 = (st_quicly_sent_block_t *)local_58._8_8_,
          *(size_t *)(local_58._8_8_ + 0x10) != 0x10)) ||
         (psVar3 = quicly_sentmap__new_block((quicly_sentmap_t *)local_58),
         psVar3 != (st_quicly_sent_block_t *)0x0)) {
        sVar4 = psVar3->next_insert_at;
        psVar3->num_entries = psVar3->num_entries + 1;
        psVar3->next_insert_at = psVar3->next_insert_at + 1;
        psVar3->entries[sVar4].acked = on_acked;
      }
      if ((((st_quicly_sent_block_t *)local_58._8_8_ != (st_quicly_sent_block_t *)0x0) &&
          (psVar3 = (st_quicly_sent_block_t *)local_58._8_8_,
          *(size_t *)(local_58._8_8_ + 0x10) != 0x10)) ||
         (psVar3 = quicly_sentmap__new_block((quicly_sentmap_t *)local_58),
         psVar3 != (st_quicly_sent_block_t *)0x0)) {
        sVar4 = psVar3->next_insert_at;
        psVar3->num_entries = psVar3->num_entries + 1;
        psVar3->next_insert_at = psVar3->next_insert_at + 1;
        psVar3->entries[sVar4].acked = on_acked;
      }
      if (local_38 == 0) {
        __assert_fail("quicly_sentmap_is_open(map)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                      ,0x10c,"void quicly_sentmap_commit(quicly_sentmap_t *, uint16_t)");
      }
      *(byte *)(local_38 + 0x19) = *(byte *)(local_38 + 0x19) | 1;
      *(undefined2 *)(local_38 + 0x1a) = 1;
      p_Stack_40 = p_Stack_40 + 1;
      local_58._16_8_ = local_58._16_8_ + 1;
      *(byte *)(local_38 + 0x19) = *(byte *)(local_38 + 0x19) | 2;
      local_38 = 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 5;
  } while (lVar7 != 10);
  if ((st_quicly_sent_block_t *)local_58._0_8_ == (st_quicly_sent_block_t *)0x0) {
    local_70.p = &quicly_sentmap__end_iter;
    sVar4 = 0;
  }
  else {
    sVar4 = *(size_t *)(local_58._0_8_ + 8);
    if (sVar4 == 0) goto LAB_00121ca6;
    local_70.p = (quicly_sent_t *)
                 ((long)&((st_quicly_sent_block_t *)(local_58._0_8_ + -0x218))->entries[0xf].data +
                 0x10);
    do {
      pqVar1 = local_70.p + 1;
      local_70.p = local_70.p + 1;
    } while (pqVar1->acked == (quicly_sent_acked_cb)0x0);
    if (pqVar1->acked != quicly_sentmap__type_packet) goto LAB_00121b37;
  }
  lVar7 = 0;
  lVar8 = 0;
  local_70.count = sVar4;
  local_70.ref = (st_quicly_sent_block_t **)local_58;
  do {
    lVar6 = 1;
    do {
      pqVar1 = local_70.p;
      if ((local_70.p)->acked != quicly_sentmap__type_packet) goto LAB_00121bf9;
      _ok((uint)(lVar6 + lVar7 == ((local_70.p)->data).packet.packet_number),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x47);
      _ok((uint)((pqVar1->data).packet.sent_at == lVar8),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x48);
      _ok((uint)((pqVar1->data).packet.ack_epoch == '\0'),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x49);
      _ok((uint)((pqVar1->data).packet.cc_bytes_in_flight == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x4a);
      quicly_sentmap_skip(&local_70);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 5;
  } while (lVar8 != 10);
  if ((local_70.p)->acked == quicly_sentmap__type_packet) {
    _ok((uint)(((local_70.p)->data).packet.packet_number == 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x4e);
    lVar7 = 0xb;
    plVar5 = (long *)local_58;
    do {
      plVar5 = (long *)*plVar5;
      lVar7 = lVar7 + -1;
    } while (plVar5 != (long *)0x0);
    _ok((uint)(lVar7 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x4f);
    local_70.ref = (st_quicly_sent_block_t **)local_58;
    if ((st_quicly_sent_block_t *)local_58._0_8_ == (st_quicly_sent_block_t *)0x0) {
      local_70.p = &quicly_sentmap__end_iter;
      sVar4 = 0;
    }
    else {
      sVar4 = *(size_t *)(local_58._0_8_ + 8);
      if (sVar4 == 0) {
LAB_00121ca6:
        local_70.ref = (st_quicly_sent_block_t **)local_58;
        __assert_fail("map->head->num_entries != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                      ,0x12f,
                      "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
      }
      local_70.p = (quicly_sent_t *)
                   ((long)&((st_quicly_sent_block_t *)(local_58._0_8_ + -0x218))->entries[0xf].data
                   + 0x10);
      do {
        pqVar1 = local_70.p + 1;
        local_70.p = local_70.p + 1;
      } while (pqVar1->acked == (quicly_sent_acked_cb)0x0);
      if (pqVar1->acked != quicly_sentmap__type_packet) {
LAB_00121b37:
        local_70.ref = (st_quicly_sent_block_t **)local_58;
        __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                      ,0x132,
                      "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
      }
    }
    local_70.count = sVar4;
    if ((local_70.p)->acked == quicly_sentmap__type_packet) {
      do {
        uVar2 = ((local_70.p)->data).packet.packet_number;
        if (10 < uVar2) {
          if (uVar2 != 0xb) {
            __assert_fail("quicly_sentmap_get(&iter)->packet_number == 11",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                          ,0x55,"void test_basic(void)");
          }
          if ((local_70.p)->acked == quicly_sentmap__type_packet) {
            psVar3 = (st_quicly_sent_block_t *)local_58;
            goto LAB_00121a83;
          }
          break;
        }
        quicly_sentmap_skip(&local_70);
      } while ((local_70.p)->acked == quicly_sentmap__type_packet);
    }
  }
  goto LAB_00121bf9;
  while (quicly_sentmap_update((quicly_sentmap_t *)psVar3,&local_70,QUICLY_SENTMAP_EVENT_EXPIRED),
        (local_70.p)->acked == quicly_sentmap__type_packet) {
LAB_00121a83:
    if (0x28 < ((local_70.p)->data).packet.packet_number) {
      _ok((uint)(on_acked_callcnt == 0x3c),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x58);
      _ok((uint)(on_acked_ackcnt == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x59);
      if ((st_quicly_sent_block_t *)local_58._0_8_ == (st_quicly_sent_block_t *)0x0) {
        local_70.p = &quicly_sentmap__end_iter;
        sVar4 = 0;
      }
      else {
        sVar4 = *(size_t *)(local_58._0_8_ + 8);
        if (sVar4 == 0) goto LAB_00121ca6;
        local_70.p = (quicly_sent_t *)
                     ((long)&((st_quicly_sent_block_t *)(local_58._0_8_ + -0x218))->entries[0xf].
                             data + 0x10);
        do {
          pqVar1 = local_70.p + 1;
          local_70.p = local_70.p + 1;
        } while (pqVar1->acked == (quicly_sent_acked_cb)0x0);
        if (pqVar1->acked != quicly_sentmap__type_packet) goto LAB_00121b37;
      }
      local_70.count = sVar4;
      local_70.ref = (st_quicly_sent_block_t **)psVar3;
      if ((local_70.p)->acked == quicly_sentmap__type_packet) {
        lVar7 = 0x14;
        do {
          pqVar1 = local_70.p;
          if (((local_70.p)->data).packet.packet_number == 0xffffffffffffffff) {
            _ok((uint)(lVar7 == 0),"%s %d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                ,0x62);
            lVar7 = 6;
            do {
              psVar3 = psVar3->next;
              lVar7 = lVar7 + -1;
            } while (psVar3 != (st_quicly_sent_block_t *)0x0);
            _ok((uint)(lVar7 == 0),"%s %d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                ,99);
            quicly_sentmap_dispose((quicly_sentmap_t *)local_58);
            return;
          }
          _ok((uint)(((local_70.p)->data).packet.cc_bytes_in_flight != 0),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
              ,0x5e);
          _ok((uint)((pqVar1->data).packet.packet_number - 0x29 < 0xffffffffffffffe2),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
              ,0x5f);
          quicly_sentmap_skip(&local_70);
          lVar7 = lVar7 + -1;
        } while ((local_70.p)->acked == quicly_sentmap__type_packet);
      }
      break;
    }
  }
LAB_00121bf9:
  __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                ,0x13c,"const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)");
}

Assistant:

static void test_basic(void)
{
    quicly_maxsender_t m;
    quicly_maxsender_sent_t ackargs;

    quicly_maxsender_init(&m, 100);

    /* basic checks */
    ok(!quicly_maxsender_should_send_max(&m, 0, 100, 512));
    ok(quicly_maxsender_should_send_max(&m, 0, 100, 1024));
    ok(!quicly_maxsender_should_send_max(&m, 99, 100, 0));
    ok(quicly_maxsender_should_send_max(&m, 100, 100, 0));

    /* scenario */
    ok(!quicly_maxsender_should_send_max(&m, 24, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 25, 100, 768));
    quicly_maxsender_record(&m, 125, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 49, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 50, 100, 768));
    quicly_maxsender_acked(&m, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 49, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 50, 100, 768));
    quicly_maxsender_record(&m, 150, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 74, 100, 768));
    quicly_maxsender_lost(&m, &ackargs);
    ok(quicly_maxsender_should_send_max(&m, 74, 100, 768));
}